

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase693::run(TestCase693 *this)

{
  byte *pbVar1;
  Builder *params;
  Builder *params_00;
  ReaderFor<capnp::Text> value;
  Array<char> AStack_1a8;
  char *local_190;
  Builder root;
  DebugComparison<const_char_(&)[33],_kj::String> _kjCondition;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> l;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::
  initRoot<capnproto_test::capnp::test::TestGenerics<capnp::Text,capnp::List<unsigned_int,(capnp::Kind)0>>::Inner>
            (&root,&builder.super_MessageBuilder);
  value.super_StringPtr.content.size_ = 5;
  value.super_StringPtr.content.ptr = "abcd";
  capnproto_test::capnp::test::TestGenerics<capnp::Text,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
  ::Inner::Builder::setFoo(&root,value);
  capnproto_test::capnp::test::TestGenerics<capnp::Text,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
  ::Inner::Builder::initBar(&l,&root,2);
  l.builder.ptr[0] = '{';
  l.builder.ptr[1] = '\0';
  l.builder.ptr[2] = '\0';
  l.builder.ptr[3] = '\0';
  pbVar1 = l.builder.ptr + (l.builder.step >> 3);
  pbVar1[0] = 200;
  pbVar1[1] = '\x01';
  pbVar1[2] = '\0';
  pbVar1[3] = '\0';
  local_190 = "(foo = \"abcd\", bar = [123, 456])";
  kj::
  str<capnproto_test::capnp::test::TestGenerics<capnp::Text,capnp::List<unsigned_int,(capnp::Kind)0>>::Inner::Builder&>
            ((String *)&AStack_1a8,(kj *)&root,params);
  kj::_::DebugExpression<char_const(&)[33]>::operator==
            (&_kjCondition,(DebugExpression<char_const(&)[33]> *)&local_190,(String *)&AStack_1a8);
  kj::Array<char>::~Array(&AStack_1a8);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::
    str<capnproto_test::capnp::test::TestGenerics<capnp::Text,capnp::List<unsigned_int,(capnp::Kind)0>>::Inner::Builder&>
              ((String *)&AStack_1a8,(kj *)&root,params_00);
    kj::_::Debug::
    log<char_const(&)[75],kj::_::DebugComparison<char_const(&)[33],kj::String>&,char_const(&)[33],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x2bd,ERROR,
               "\"failed: expected \" \"(\\\"(foo = \\\\\\\"abcd\\\\\\\", bar = [123, 456])\\\") == (kj::str(root))\", _kjCondition, \"(foo = \\\"abcd\\\", bar = [123, 456])\", kj::str(root)"
               ,(char (*) [75])
                "failed: expected (\"(foo = \\\"abcd\\\", bar = [123, 456])\") == (kj::str(root))",
               &_kjCondition,(char (*) [33])"(foo = \"abcd\", bar = [123, 456])",
               (String *)&AStack_1a8);
    kj::Array<char>::~Array(&AStack_1a8);
  }
  kj::Array<char>::~Array(&_kjCondition.right.content);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Stringify, Generics) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestGenerics<Text, List<uint32_t>>::Inner>();
  root.setFoo("abcd");
  auto l = root.initBar(2);
  l.set(0, 123);
  l.set(1, 456);

  EXPECT_EQ("(foo = \"abcd\", bar = [123, 456])", kj::str(root));
}